

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  bool bVar1;
  char *pcVar2;
  pointer ppcVar3;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  string currentStart;
  string filesDir;
  cmMakefileCurrent cmf;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> local_90;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  cmMakefileCurrent local_38;
  
  cmMakefileCurrent::cmMakefileCurrent(&local_38,this);
  pcVar2 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  std::__cxx11::string::string((string *)local_58,pcVar2,(allocator *)local_78);
  std::__cxx11::string::append((char *)local_58);
  cmsys::SystemTools::MakeDirectory((char *)local_58[0]);
  pcVar2 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  std::__cxx11::string::string((string *)local_78,pcVar2,(allocator *)&local_90);
  std::__cxx11::string::append((char *)local_78);
  bVar1 = cmsys::SystemTools::FileExists((char *)local_78[0],true);
  if (bVar1) {
    ProcessBuildsystemFile(this,(char *)local_78[0]);
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              (&local_90,&this->UnConfiguredDirectories);
    for (ppcVar3 = local_90.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppcVar3 !=
        local_90.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
      ConfigureSubDirectory(this,*ppcVar3);
    }
    AddCMakeDependFilesFromUser(this);
    this->Configured = true;
    if (local_90.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    cmMakefileCurrent::~cmMakefileCurrent(&local_38);
    return;
  }
  __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                ,0x685,"void cmMakefile::Configure()");
}

Assistant:

void cmMakefile::Configure()
{
  cmMakefileCurrent cmf(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetCurrentBinaryDirectory();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  std::string currentStart = this->StateSnapshot.GetCurrentSourceDirectory();
  currentStart += "/CMakeLists.txt";
  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->ProcessBuildsystemFile(currentStart.c_str());

   // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi)
    {
    this->ConfigureSubDirectory(*sdi);
    }

  this->AddCMakeDependFilesFromUser();
  this->SetConfigured();
}